

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandSwapPos(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint iOutput;
  Abc_Ntk_t *pAVar2;
  int iVar3;
  char *format;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  iOutput = 0xffffffff;
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"Nh");
    iVar3 = globalUtilOptind;
    if (iVar1 != 0x4e) {
      if (iVar1 == -1) {
        if (pAVar2 == (Abc_Ntk_t *)0x0) {
          format = "Empty network.\n";
        }
        else if (pAVar2->ntkType == ABC_NTK_STRASH) {
          if ((int)iOutput < 0) {
            format = "The output index is not specified.\n";
          }
          else {
            if ((int)iOutput < pAVar2->vPos->nSize) {
              pAVar2 = Abc_NtkDup(pAVar2);
              Abc_NtkSwapOneOutput(pAVar2,iOutput);
              Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
              return 0;
            }
            format = "The output index is larger than the allowed POs.\n";
          }
        }
        else {
          format = "The network is not strashed.\n";
        }
        iVar3 = -1;
        goto LAB_001f846f;
      }
      goto LAB_001f840a;
    }
    if (argc <= globalUtilOptind) break;
    iOutput = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
    if ((int)iOutput < 0) {
LAB_001f840a:
      iVar3 = -2;
      Abc_Print(-2,"usage: swappos [-N <num>] [-h]\n");
      Abc_Print(-2,"\t           swap the 0-th PO with the <num>-th PO\n");
      Abc_Print(-2,"\t-N <num> : the zero-based index of the PO to swap [default = %d]\n",
                (ulong)iOutput);
      format = "\t-h       : print the command usage\n";
LAB_001f846f:
      Abc_Print(iVar3,format);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
  goto LAB_001f840a;
}

Assistant:

int Abc_CommandSwapPos( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc), * pNtkRes;
    int c, iOutput = -1;
    extern void Abc_NtkSwapOneOutput( Abc_Ntk_t * pNtk, int iOutput );

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            iOutput = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iOutput < 0 )
                goto usage;
            break;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "The network is not strashed.\n" );
        return 1;
    }
    if ( iOutput < 0 )
    {
        Abc_Print( -1, "The output index is not specified.\n" );
        return 1;
    }
    if ( iOutput >= Abc_NtkPoNum(pNtk) )
    {
        Abc_Print( -1, "The output index is larger than the allowed POs.\n" );
        return 1;
    }

    // get the new network
    pNtkRes = Abc_NtkDup( pNtk );
    Abc_NtkSwapOneOutput( pNtkRes, iOutput );
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: swappos [-N <num>] [-h]\n" );
    Abc_Print( -2, "\t           swap the 0-th PO with the <num>-th PO\n" );
    Abc_Print( -2, "\t-N <num> : the zero-based index of the PO to swap [default = %d]\n", iOutput );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}